

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O0

bool __thiscall Opcode::AABBNoLeafTree::Build(AABBNoLeafTree *this,AABBTree *tree)

{
  undefined1 auVar1 [16];
  AABBNoLeafNode *pAVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  AABBNoLeafNode *pAVar6;
  ulong uVar7;
  AABBNoLeafNode *local_e8;
  udword local_a8 [2];
  udword CurID;
  udword local_98;
  udword local_94;
  udword NbNodes;
  udword NbTriangles;
  AABBTree *tree_local;
  AABBNoLeafTree *this_local;
  AABBTree *local_78;
  AABBTree *local_70;
  AABBNoLeafNode *local_68;
  AABBNoLeafNode *local_58;
  AABBNoLeafNode *local_38;
  Point *local_30;
  AABBNoLeafNode *local_28;
  AABBNoLeafNode *local_20;
  AABBNoLeafNode *local_18;
  Point *local_10;
  
  if (tree == (AABBTree *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_94 = (tree->super_AABBTreeNode).mNbPrimitives;
    local_98 = tree->mTotalNbNodes;
    if (local_98 == local_94 * 2 - 1) {
      _NbNodes = tree;
      tree_local = (AABBTree *)this;
      local_78 = tree;
      local_70 = tree;
      if ((this->super_AABBOptimizedTree).mNbNodes != local_94 - 1) {
        (this->super_AABBOptimizedTree).mNbNodes = local_94 - 1;
        if (this->mNodes != (AABBNoLeafNode *)0x0) {
          pAVar6 = this->mNodes;
          if (pAVar6 != (AABBNoLeafNode *)0x0) {
            pAVar2 = pAVar6 + pAVar6[-1].mNegData;
            while (pAVar6 != pAVar2) {
              local_30 = &pAVar2[-1].mAABB.mExtents;
              pAVar2 = pAVar2 + -1;
              local_28 = pAVar2;
              local_38 = pAVar2;
              local_68 = pAVar2;
            }
            operator_delete__(&pAVar6[-1].mNegData,pAVar6[-1].mNegData * 0x28 + 8);
          }
          this->mNodes = (AABBNoLeafNode *)0x0;
        }
        uVar3 = CONCAT44(0,(this->super_AABBOptimizedTree).mNbNodes);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        uVar4 = SUB168(auVar1 * ZEXT816(0x28),0);
        uVar7 = uVar4 + 8;
        if (SUB168(auVar1 * ZEXT816(0x28),8) != 0 || 0xfffffffffffffff7 < uVar4) {
          uVar7 = 0xffffffffffffffff;
        }
        puVar5 = (ulong *)operator_new__(uVar7);
        *puVar5 = uVar3;
        pAVar6 = (AABBNoLeafNode *)(puVar5 + 1);
        if (uVar3 != 0) {
          local_e8 = pAVar6;
          do {
            local_58 = local_e8;
            local_20 = local_e8;
            local_18 = local_e8;
            local_10 = &(local_e8->mAABB).mExtents;
            local_e8->mPosData = 0;
            local_e8->mNegData = 0;
            local_e8 = local_e8 + 1;
          } while (local_e8 != pAVar6 + uVar3);
        }
        this->mNodes = pAVar6;
        if (this->mNodes == (AABBNoLeafNode *)0x0) {
          return false;
        }
      }
      local_a8[0] = 1;
      _BuildNoLeafTree(this->mNodes,0,local_a8,&_NbNodes->super_AABBTreeNode);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AABBNoLeafTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	if(mNbNodes!=NbTriangles-1)	// Same number of nodes => keep moving
	{
		mNbNodes = NbTriangles-1;
		DELETEARRAY(mNodes);
		mNodes = new AABBNoLeafNode[mNbNodes];
		CHECKALLOC(mNodes);
	}

	// Build the tree
	udword CurID = 1;
	_BuildNoLeafTree(mNodes, 0, CurID, tree);
	ASSERT(CurID==mNbNodes);

	return true;
}